

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
::
remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
          (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
           *this,node_type type,byte *args,
          basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *args_1,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *args_2,basic_node_ptr<unodb::detail::node_header> **args_3)

{
  undefined7 in_register_00000031;
  _Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true> _Var1;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_02;
  node_ptr *in_stack_00000008;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
              ();
    break;
  case 1:
    k.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )impl_helpers::
           remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                     ((impl_helpers *)this,
                      (inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k,
                      (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)*args_3,in_stack_00000008);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 2:
    k_00.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_00.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )impl_helpers::
           remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                     ((impl_helpers *)this,
                      (inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_00,
                      (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)*args_3,in_stack_00000008);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 3:
    k_02.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_02.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )impl_helpers::
           remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                     ((impl_helpers *)this,
                      (inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_02,
                      (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)*args_3,in_stack_00000008);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  case 4:
    k_01.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)args_2;
    k_01.field_0.key._M_ptr = (pointer)(args_1->field_0).key._M_extent._M_extent_value;
    _Var1._M_payload.
    super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> =
         (_Optional_payload<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true,_true>
          )impl_helpers::
           remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_256<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                     ((impl_helpers *)this,
                      (inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)(ulong)*args,(byte)*(undefined8 *)&args_1->field_0,k_01,
                      (db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                       *)*args_3,in_stack_00000008);
    return (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           (_Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>)
           _Var1._M_payload.
           super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
    ;
  }
  remove_or_choose_subtree<std::optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
            ();
}

Assistant:

[[nodiscard]] ReturnType remove_or_choose_subtree(node_type type,
                                                    Args &&...args) {
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->remove_or_choose_subtree(
            std::forward<Args>(args)...);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }